

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCaseInstance::verify
          (LinearDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  DerivateFunc DVar2;
  int iVar3;
  Precision PVar4;
  DerivateCaseValues *pDVar5;
  DerivateCaseDefinition *pDVar6;
  bool bVar7;
  float fVar8;
  int iVar9;
  undefined8 uVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Vector<float,_4> *v;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  LogVecComps local_278;
  Vec4 valueRamp;
  Vec4 reference;
  Vec4 threshold;
  Vec4 scale;
  Vector<float,_4> local_208;
  Vector<float,_4> local_1f8;
  Vec4 opThreshold;
  Vec4 surfaceThreshold;
  Vector<float,_3> local_1c0;
  Linear2DFunctionEvaluator function;
  
  local_1f8.m_data[0] = 1.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.5;
  local_1f8.m_data[3] = -0.5;
  local_208.m_data[0] = 0.0;
  local_208.m_data[1] = 1.0;
  local_208.m_data[2] = 0.5;
  local_208.m_data[3] = -0.5;
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)&function);
  tcu::abs<float,4>((tcu *)&scale,&((this->super_TriangleDerivateCaseInstance).m_values)->derivScale
                   );
  tcu::operator/((tcu *)&surfaceThreshold,(Vector<float,_4> *)&function,(Vector<float,_4> *)&scale);
  DVar2 = ((this->super_TriangleDerivateCaseInstance).m_definitions)->func;
  if (DVar2 < DERIVATE_DFDY) {
    v = &local_1f8;
    lVar13 = 8;
  }
  else {
    if (2 < DVar2 - DERIVATE_DFDY) {
      iVar9 = *(int *)(ctx + 8);
      iVar3 = *(int *)(ctx + 0xc);
      pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
      tcu::operator-((tcu *)&reference,&pDVar5->coordMax,&pDVar5->coordMin);
      tcu::operator/((tcu *)&scale,(Vector<float,_4> *)&reference,(float)iVar9);
      tcu::operator*((tcu *)&function,(Vector<float,_4> *)&scale,&local_1f8);
      pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
      tcu::operator-((tcu *)&opThreshold,&pDVar5->coordMax,&pDVar5->coordMin);
      tcu::operator/((tcu *)&reference,(Vector<float,_4> *)&opThreshold,(float)iVar3);
      tcu::operator*((tcu *)&scale,(Vector<float,_4> *)&reference,&local_208);
      tcu::abs<float,4>((tcu *)&opThreshold,(Vector<float,_4> *)&function);
      tcu::abs<float,4>((tcu *)&threshold,(Vector<float,_4> *)&scale);
      tcu::operator+((tcu *)&reference,(Vector<float,_4> *)&opThreshold,
                     (Vector<float,_4> *)&threshold);
      PVar4 = ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision;
      tcu::operator*((tcu *)&threshold,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin,&local_1f8);
      tcu::operator*((tcu *)&valueRamp,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,&local_1f8);
      getDerivateThreshold
                ((anon_unknown_0 *)&opThreshold,PVar4,&threshold,&valueRamp,(Vec4 *)&function);
      PVar4 = ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision;
      tcu::operator*((tcu *)&valueRamp,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin,&local_208);
      tcu::operator*((tcu *)&local_278,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,&local_208);
      getDerivateThreshold((anon_unknown_0 *)&threshold,PVar4,&valueRamp,(Vec4 *)&local_278,&scale);
      tcu::max<float,4>((tcu *)&local_278,(Vector<float,_4> *)&opThreshold,
                        (Vector<float,_4> *)&threshold);
      tcu::max<float,4>((tcu *)&valueRamp,&surfaceThreshold,(Vector<float,_4> *)&local_278);
      pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
      bVar7 = verifyConstantDerivate
                        (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                          super_TestInstance.m_context)->m_testCtx->m_log,
                         (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                         ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,
                         &reference,&valueRamp,&pDVar5->derivScale,&pDVar5->derivBias,LOG_ALL);
      return (int)CONCAT71(extraout_var_00,bVar7);
    }
    v = &local_208;
    lVar13 = 0xc;
  }
  iVar9 = *(int *)(ctx + lVar13);
  tcu::Vector<float,_4>::Vector(&scale,v);
  pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
  tcu::operator-((tcu *)&function,&pDVar5->coordMax,&pDVar5->coordMin);
  tcu::operator/((tcu *)&reference,(Vector<float,_4> *)&function,(float)iVar9);
  pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
  getDerivateThreshold
            ((anon_unknown_0 *)&opThreshold,
             ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision,&pDVar5->coordMin
             ,&pDVar5->coordMax,&reference);
  tcu::max<float,4>((tcu *)&threshold,&surfaceThreshold,(Vector<float,_4> *)&opThreshold);
  fVar8 = (float)glu::getDataTypeFloatScalars
                           (((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType);
  tcu::operator*((tcu *)&function,(Vector<float,_4> *)&reference,&scale);
  reference.m_data[0] = function.matrix.m_data.m_data[0].m_data[0];
  reference.m_data[1] = function.matrix.m_data.m_data[0].m_data[1];
  reference.m_data[2] = function.matrix.m_data.m_data[0].m_data[2];
  reference.m_data[3] = function.matrix.m_data.m_data[0].m_data[3];
  function.matrix.m_data.m_data[0].m_data._0_8_ =
       ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.super_TestInstance
       .m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying result image.\n");
  std::operator<<((ostream *)poVar1,"\tValid derivative is ");
  valueRamp.m_data._0_8_ = (tcu *)&reference;
  valueRamp.m_data[2] = fVar8;
  tcu::MessageBuilder::operator<<((MessageBuilder *)&function,(LogVecComps *)&valueRamp);
  std::operator<<((ostream *)poVar1," with threshold ");
  local_278.v = &threshold;
  local_278.numComps = (int)fVar8;
  tcu::MessageBuilder::operator<<((MessageBuilder *)&function,&local_278);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
  bVar7 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                      super_TestInstance.m_context)->m_testCtx->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,&reference
                     ,&threshold,&pDVar5->derivScale,&pDVar5->derivBias,LOG_NOTHING);
  if (bVar7) {
    function.matrix.m_data.m_data[0].m_data._0_8_ =
         ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
          super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"No incorrect derivatives found, result valid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uVar10 = std::__cxx11::ostringstream::~ostringstream(poVar1);
    iVar9 = (int)CONCAT71((int7)((ulong)uVar10 >> 8),1);
  }
  else {
    function.matrix.m_data.m_data[0].m_data._0_8_ =
         ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
          super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                   );
    std::operator<<((ostream *)poVar1,
                    "\tVerifying each result derivative is within its range of legal result values."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
    tcu::operator-((tcu *)&valueRamp,&pDVar5->coordMax,&pDVar5->coordMin);
    tcu::Matrix<float,_4,_3>::Matrix(&function.matrix);
    local_278.numComps =
         (int)(((this->super_TriangleDerivateCaseInstance).m_values)->coordMin).m_data[0];
    local_278.v = (Vec4 *)(ulong)(uint)(valueRamp.m_data[0] / 99.0);
    tcu::Matrix<float,_4,_3>::setRow(&function.matrix,0,(Vector<float,_3> *)&local_278);
    local_278.numComps =
         (int)(((this->super_TriangleDerivateCaseInstance).m_values)->coordMin).m_data[1];
    local_278.v = (Vec4 *)((ulong)(uint)(valueRamp.m_data[1] / 133.0) << 0x20);
    tcu::Matrix<float,_4,_3>::setRow(&function.matrix,1,(Vector<float,_3> *)&local_278);
    local_1c0.m_data[2] =
         (((this->super_TriangleDerivateCaseInstance).m_values)->coordMin).m_data[2];
    auVar11._4_4_ = valueRamp.m_data[2];
    auVar11._0_4_ = valueRamp.m_data[2];
    auVar11._8_4_ = valueRamp.m_data[3];
    auVar11._12_4_ = valueRamp.m_data[3];
    auVar11 = divps(auVar11,_DAT_009b37f0);
    local_1c0.m_data[2] = local_1c0.m_data[2] + local_1c0.m_data[2];
    local_1c0.m_data._0_8_ = auVar11._0_8_;
    tcu::operator/((tcu *)&local_278,&local_1c0,2.0);
    tcu::Matrix<float,_4,_3>::setRow(&function.matrix,2,(Vector<float,_3> *)&local_278);
    local_1c0.m_data[2] =
         (((this->super_TriangleDerivateCaseInstance).m_values)->coordMax).m_data[3];
    auVar12._4_4_ = valueRamp.m_data[3];
    auVar12._0_4_ = valueRamp.m_data[3];
    auVar12._8_4_ = valueRamp.m_data[3];
    auVar12._12_4_ = valueRamp.m_data[3];
    auVar11 = divps(auVar12,_DAT_009b3800);
    local_1c0.m_data[2] = local_1c0.m_data[2] + local_1c0.m_data[2];
    local_1c0.m_data._0_8_ = auVar11._0_8_;
    tcu::operator/((tcu *)&local_278,&local_1c0,2.0);
    tcu::Matrix<float,_4,_3>::setRow(&function.matrix,3,(Vector<float,_3> *)&local_278);
    pDVar6 = (this->super_TriangleDerivateCaseInstance).m_definitions;
    pDVar5 = (this->super_TriangleDerivateCaseInstance).m_values;
    bVar7 = reverifyConstantDerivateWithFlushRelaxations
                      (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                        super_TestInstance.m_context)->m_testCtx->m_log,
                       (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,pDVar6->dataType,
                       pDVar6->precision,&pDVar5->derivScale,&pDVar5->derivBias,&surfaceThreshold,
                       pDVar6->func,(Linear2DFunctionEvaluator *)&function.matrix);
    iVar9 = (int)CONCAT71(extraout_var,bVar7);
  }
  return iVar9;
}

Assistant:

bool LinearDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	if (isDfdxFunc(m_definitions.func) || isDfdyFunc(m_definitions.func))
	{
		const bool			isX			= isDfdxFunc(m_definitions.func);
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		tcu::Vec4			reference	= ((m_values.coordMax - m_values.coordMin) / div);
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin, m_values.coordMax, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_definitions.dataType);

		/* adjust the reference value for the correct dfdx or dfdy sample adjacency */
		reference = reference * scale;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								   reference, threshold, m_values.derivScale, m_values.derivBias,
								   LOG_NOTHING))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::UVec2			viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_values.coordMax - m_values.coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_values.coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_values.coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_values.coordMin.z() + m_values.coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_values.coordMax.w() + m_values.coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_context.getTestContext().getLog(), result, errorMask,
																m_definitions.dataType, m_definitions.precision, m_values.derivScale,
																m_values.derivBias, surfaceThreshold, m_definitions.func,
																function);
		}
	}
	else
	{
		DE_ASSERT(isFwidthFunc(m_definitions.func));
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_values.coordMax - m_values.coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_values.coordMax - m_values.coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*xScale, m_values.coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*yScale, m_values.coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
									  reference, threshold, m_values.derivScale, m_values.derivBias);
	}
}